

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O3

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitMathBuiltin
          (AsmJSByteCodeGenerator *this,ParseNode *pnode,AsmJsMathFunction *mathFunction)

{
  AsmJsByteCodeWriter *this_00;
  OpCode OVar1;
  ushort argCount;
  AsmJsFunc *pAVar2;
  code *pcVar3;
  ParseNode *node;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ArgSlot AVar7;
  BOOL BVar8;
  Types TVar9;
  AsmJsType AVar10;
  RegSlot R0;
  uint uVar11;
  EmitExpressionInfo EVar12;
  ParseNodeCall *pPVar13;
  ParseNodeUni *pPVar14;
  ParseNodeInt *pPVar15;
  undefined4 *puVar16;
  char *pcVar17;
  HeapAllocator *this_01;
  ParseNodeBin *pPVar18;
  RegisterSpace *pRVar19;
  AsmJsType extraout_var;
  undefined4 extraout_var_00;
  ParseNodeFloat *pPVar20;
  AsmJsCompilationException *pAVar21;
  int32 i32y;
  uint uVar22;
  char *pcVar23;
  ulong uVar24;
  long lVar25;
  uint *puVar26;
  ParseNodePtr this_02;
  ParseNodePtr pnode_00;
  long lVar27;
  RegSlot *pRVar28;
  ulong uVar29;
  float fVar30;
  undefined1 local_b8 [8];
  AsmJsRetType retType;
  AsmJsRetType local_8c;
  AutoArrayPtr<Js::AsmJsType> local_88;
  AsmJsType local_74;
  HeapAllocator *local_70;
  ParseNode *local_68;
  EmitExpressionInfo local_60;
  AutoArrayPtr<Js::EmitExpressionInfo> local_58;
  OpCodeAsmJs local_3a;
  char cStack_38;
  undefined7 uStack_37;
  OpCodeAsmJs op;
  
  if ((mathFunction->mBuiltIn & ~AsmJSMathBuiltin_cos) == AsmJSMathBuiltin_min) {
    EVar12 = EmitMinMax(this,pnode,mathFunction);
    local_70 = (HeapAllocator *)((ulong)EVar12 >> 0x20);
    goto LAB_0093aa14;
  }
  pPVar13 = ParseNode::AsParseNodeCall(pnode);
  argCount = pPVar13->argCount;
  uVar29 = (ulong)argCount;
  local_68 = pnode;
  pPVar13 = ParseNode::AsParseNodeCall(pnode);
  this_02 = pPVar13->pnodeArgs;
  local_60 = (EmitExpressionInfo)mathFunction;
  bVar4 = AsmJsMathFunction::IsFround(&mathFunction->super_AsmJsFunctionDeclaration);
  _cStack_38 = (ByteCodeWriter *)CONCAT71(uStack_37,!bVar4);
  if (uVar29 != 1 || !bVar4) {
    local_88.super_BasePtr<Js::AsmJsType>.ptr = (AsmJsType *)0x0;
    local_88.m_elementCount = 0;
    local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr = (EmitExpressionInfo *)0x0;
    local_58.m_elementCount = 0;
    if (uVar29 != 0) goto LAB_0093a3a0;
  }
  else {
    if (this_02 != (ParseNode *)0x0) {
      OVar1 = this_02->nop;
      if ((OVar1 == knopInt) || (OVar1 == knopFlt)) {
LAB_0093aa30:
        this_00 = &this->mWriter;
        ByteCodeWriter::StartStatement(&this_00->super_ByteCodeWriter,local_68,0);
        pAVar2 = this->mFunction;
        TVar9 = WAsmJs::FromPrimitiveType<float>();
        pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                            (&pAVar2->mTypedRegisterAllocator,TVar9);
        R0 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar19);
        EVar12.type.which_ = Int;
        EVar12.super_EmitInfoBase.location = R0;
        OVar1 = this_02->nop;
        if (OVar1 == knopInt) {
          pPVar15 = ParseNode::AsParseNodeInt(this_02);
          fVar30 = (float)pPVar15->lw;
        }
        else if (OVar1 == knopNeg) {
          pPVar14 = ParseNode::AsParseNodeUni(this_02);
          if (pPVar14->pnode1->nop == knopInt) {
            pPVar14 = ParseNode::AsParseNodeUni(this_02);
            pPVar15 = ParseNode::AsParseNodeInt(pPVar14->pnode1);
            if (pPVar15->lw != 0) goto LAB_0093aab7;
          }
          else {
LAB_0093aab7:
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar16 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                        ,0x4a1,"(ParserWrapper::IsNegativeZero(argNode))",
                                        "ParserWrapper::IsNegativeZero(argNode)");
            if (!bVar4) goto LAB_0093ac84;
            *puVar16 = 0;
          }
          fVar30 = -0.0;
        }
        else {
          if (OVar1 != knopFlt) goto LAB_0093aab7;
          pPVar20 = ParseNode::AsParseNodeFloat(this_02);
          fVar30 = (float)pPVar20->dbl;
        }
        _cStack_38 = (ByteCodeWriter *)CONCAT44(uStack_37._3_4_,fVar30);
        pAVar2 = this->mFunction;
        TVar9 = WAsmJs::FromPrimitiveType<float>();
        pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                            (&pAVar2->mTypedRegisterAllocator,TVar9);
        lVar27 = *(long *)&pRVar19[1].mFirstTmpReg;
        uVar11 = 0;
        if (lVar27 != 0) {
          uVar11 = JsUtil::
                   BaseDictionary<float,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ::GetBucket((int)(long)_cStack_38 * 2 + 1,pRVar19[2].mNbConst,
                               pRVar19[3].mNextLocation);
          uVar22 = *(uint *)(lVar27 + (ulong)uVar11 * 4);
          uVar11 = 0;
          if (-1 < (int)uVar22) {
            lVar27 = *(long *)&pRVar19[1].mNbConst;
            uVar11 = 0;
            do {
              uVar29 = (ulong)uVar22;
              if ((float)*(int *)(lVar27 + 8 + uVar29 * 0xc) == _cStack_38) {
                if (*(DictionaryStats **)&pRVar19[3].mNbConst != (DictionaryStats *)0x0) {
                  DictionaryStats::Lookup(*(DictionaryStats **)&pRVar19[3].mNbConst,uVar11);
                  lVar27._0_4_ = pRVar19[1].mNbConst;
                  lVar27._4_4_ = pRVar19[1].mType;
                }
                pRVar28 = (RegSlot *)(lVar27 + uVar29 * 0xc);
                goto LAB_0093abd1;
              }
              uVar11 = uVar11 + 1;
              uVar22 = *(uint *)(lVar27 + uVar29 * 0xc + 4);
            } while (-1 < (int)uVar22);
          }
        }
        pRVar28 = &Constants::NoRegister;
        if (*(DictionaryStats **)&pRVar19[3].mNbConst != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(*(DictionaryStats **)&pRVar19[3].mNbConst,uVar11);
        }
LAB_0093abd1:
        node = local_68;
        AsmJsByteCodeWriter::AsmReg2(this_00,Ld_Flt,R0,*pRVar28);
        ByteCodeWriter::EndStatement(&this_00->super_ByteCodeWriter,node);
        local_70 = (HeapAllocator *)&DAT_00000003;
        goto LAB_0093aa14;
      }
      if ((OVar1 == knopNeg) &&
         (pPVar14 = ParseNode::AsParseNodeUni(this_02), pPVar14->pnode1->nop == knopInt)) {
        pPVar14 = ParseNode::AsParseNodeUni(this_02);
        pPVar15 = ParseNode::AsParseNodeInt(pPVar14->pnode1);
        if (pPVar15->lw == 0) goto LAB_0093aa30;
      }
    }
LAB_0093a3a0:
    local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr = (EmitExpressionInfo *)0x0;
    local_58.m_elementCount = 0;
    local_88.super_BasePtr<Js::AsmJsType>.ptr = (AsmJsType *)0x0;
    local_88.m_elementCount = 0;
    local_b8 = (undefined1  [8])&AsmJsType::typeinfo;
    _retType = 0;
    local_70 = Memory::HeapAllocator::TrackAllocInfo
                         (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_b8);
    BVar8 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar8 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_0093ac84;
      *puVar16 = 0;
    }
    pcVar17 = Memory::HeapAllocator::AllocT<false>(local_70,(ulong)((uint)argCount * 4));
    if (pcVar17 == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      local_70 = (HeapAllocator *)__tls_get_addr(&PTR_01548f08);
      *(undefined4 *)&local_70->m_privateHeap = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_0093ac84;
      *(undefined4 *)&local_70->m_privateHeap = 0;
    }
    memset(pcVar17,0xff,(ulong)((uint)argCount * 4));
    if (local_88.super_BasePtr<Js::AsmJsType>.ptr != (AsmJsType *)0x0) {
      Memory::DeleteArray<Memory::HeapAllocator,Js::AsmJsType>
                (&Memory::HeapAllocator::Instance,local_88.m_elementCount,
                 local_88.super_BasePtr<Js::AsmJsType>.ptr);
    }
    local_88.m_elementCount._0_2_ = argCount;
    local_88.super_BasePtr<Js::AsmJsType>.ptr = (AsmJsType *)pcVar17;
    local_88.m_elementCount._2_6_ = 0;
    local_b8 = (undefined1  [8])&EmitExpressionInfo::typeinfo;
    _retType = 0;
    this_01 = Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_b8);
    BVar8 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar8 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_0093ac84;
      *puVar16 = 0;
    }
    pcVar17 = Memory::HeapAllocator::AllocT<false>(this_01,(ulong)((uint)argCount * 8));
    if (pcVar17 == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_0093ac84;
      *puVar16 = 0;
    }
    pcVar23 = pcVar17;
    do {
      pcVar23[0] = -1;
      pcVar23[1] = -1;
      pcVar23[2] = -1;
      pcVar23[3] = -1;
      pcVar23[4] = '\r';
      pcVar23[5] = '\0';
      pcVar23[6] = '\0';
      pcVar23[7] = '\0';
      pcVar23 = pcVar23 + 8;
    } while (pcVar23 != pcVar17 + uVar29 * 8);
    if (local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr != (EmitExpressionInfo *)0x0) {
      Memory::DeleteArray<Memory::HeapAllocator,Js::EmitExpressionInfo>
                (&Memory::HeapAllocator::Instance,local_58.m_elementCount,
                 local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr);
    }
    local_58.m_elementCount._0_2_ = argCount;
    local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr = (EmitExpressionInfo *)pcVar17;
    local_58.m_elementCount._2_6_ = 0;
    if (uVar29 != 0) {
      uVar24 = 0;
      do {
        if (this_02->nop == knopCall && cStack_38 == '\0') {
          AsmJsRetType::AsmJsRetType(&local_8c,Float);
          EVar12 = EmitCall(this,this_02,local_8c);
        }
        else {
          pnode_00 = this_02;
          if (this_02->nop == knopList) {
            pPVar18 = ParseNode::AsParseNodeBin(this_02);
            pnode_00 = pPVar18->pnode1;
            pPVar18 = ParseNode::AsParseNodeBin(this_02);
            this_02 = pPVar18->pnode2;
          }
          EVar12 = Emit(this,pnode_00);
        }
        local_88.super_BasePtr<Js::AsmJsType>.ptr[uVar24].which_ = EVar12.type.which_.which_;
        local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr[uVar24] = EVar12;
        uVar24 = uVar24 + 1;
      } while (uVar29 != uVar24);
    }
  }
  _cStack_38 = &(this->mWriter).super_ByteCodeWriter;
  ByteCodeWriter::StartStatement(_cStack_38,local_68,0);
  AsmJsRetType::AsmJsRetType((AsmJsRetType *)local_b8);
  bVar4 = AsmJsMathFunction::SupportsMathCall
                    ((AsmJsMathFunction *)local_60,argCount,
                     local_88.super_BasePtr<Js::AsmJsType>.ptr,&local_3a,(AsmJsRetType *)local_b8);
  if (!bVar4) {
    pAVar21 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (pAVar21,L"Math builtin function doesn\'t support arguments");
    __cxa_throw(pAVar21,&AsmJsCompilationException::typeinfo,0);
  }
  lVar25 = uVar29 + 1;
  lVar27 = uVar29 * 8;
  while( true ) {
    if (lVar25 + -1 == 0 || lVar25 < 1) break;
    AsmJsFunc::ReleaseLocationGeneric
              (this->mFunction,
               (EmitExpressionInfo *)
               ((long)&local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr[-1].super_EmitInfoBase.
                       location + lVar27));
    lVar25 = lVar25 + -1;
    lVar27 = lVar27 + -8;
  }
  AVar7 = AsmJsFunctionDeclaration::GetArgByteSize((AsmJsFunctionDeclaration *)local_60,argCount);
  AsmJsFunc::UpdateMaxArgOutDepth(this->mFunction,(AVar7 + 8 >> 3) + 2);
  local_74 = AsmJsRetType::toType((AsmJsRetType *)local_b8);
  bVar4 = AsmJsType::isInt(&local_74);
  local_74 = AsmJsRetType::toType((AsmJsRetType *)local_b8);
  bVar5 = AsmJsType::isFloatish(&local_74);
  if (!bVar4 && !bVar5) {
    local_74 = AsmJsRetType::toType((AsmJsRetType *)local_b8);
    bVar6 = AsmJsType::isDouble(&local_74);
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                  ,0x4e5,"(isInt || isFloatish || retType.toType().isDouble())",
                                  "isInt || isFloatish || retType.toType().isDouble()");
      if (!bVar6) goto LAB_0093ac84;
      *puVar16 = 0;
    }
  }
  pAVar2 = this->mFunction;
  if (bVar4) {
    TVar9 = WAsmJs::FromPrimitiveType<int>();
  }
  else if (bVar5) {
    TVar9 = WAsmJs::FromPrimitiveType<float>();
  }
  else {
    TVar9 = WAsmJs::FromPrimitiveType<double>();
  }
  pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(&pAVar2->mTypedRegisterAllocator,TVar9)
  ;
  local_60.super_EmitInfoBase.location = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar19);
  local_60.type.which_ = extraout_var.which_;
  AVar10 = AsmJsRetType::toType((AsmJsRetType *)local_b8);
  local_70 = (HeapAllocator *)CONCAT44(extraout_var_00,AVar10.which_);
  if (uVar29 == 1) {
    AsmJsByteCodeWriter::AsmReg2
              ((AsmJsByteCodeWriter *)_cStack_38,local_3a,
               local_60.super_EmitInfoBase.location.location,
               ((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->super_EmitInfoBase).location);
LAB_0093a8d5:
    lVar27 = 0;
    do {
      bVar4 = AsmJsType::isSubType
                        ((AsmJsType *)
                         ((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->type).which_
                         + lVar27),(AsmJsType)0x7);
      if (bVar4) {
        pAVar2 = this->mFunction;
        puVar26 = (uint *)((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->
                                  super_EmitInfoBase).location + lVar27);
        TVar9 = WAsmJs::FromPrimitiveType<float>();
        pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                            (&pAVar2->mTypedRegisterAllocator,TVar9);
        if (((puVar26 == (uint *)0x0) || (uVar22 = *puVar26, uVar22 == 0xffffffff)) ||
           (pRVar19->mRegisterCount <= uVar22)) {
          pAVar21 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
          AsmJsCompilationException::AsmJsCompilationException
                    (pAVar21,L"Invalid Node location[%d] ",
                     (ulong)*(uint *)((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->
                                             super_EmitInfoBase).location + lVar27));
LAB_0093ac73:
          __cxa_throw(pAVar21,&AsmJsCompilationException::typeinfo,0);
        }
      }
      else {
        bVar4 = AsmJsType::isSubType
                          ((AsmJsType *)
                           ((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->type).
                                   which_ + lVar27),(AsmJsType)0x4);
        if (bVar4) {
          pAVar2 = this->mFunction;
          puVar26 = (uint *)((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->
                                    super_EmitInfoBase).location + lVar27);
          TVar9 = WAsmJs::FromPrimitiveType<double>();
          pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                              (&pAVar2->mTypedRegisterAllocator,TVar9);
          if (((puVar26 == (uint *)0x0) || (uVar22 = *puVar26, uVar22 == 0xffffffff)) ||
             (pRVar19->mRegisterCount <= uVar22)) {
            pAVar21 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
            AsmJsCompilationException::AsmJsCompilationException
                      (pAVar21,L"Invalid Node location[%d] ",
                       (ulong)*(uint *)((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)
                                               ->super_EmitInfoBase).location + lVar27));
            goto LAB_0093ac73;
          }
        }
        else {
          bVar4 = AsmJsType::isSubType
                            ((AsmJsType *)
                             ((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->type).
                                     which_ + lVar27),(AsmJsType)0xc);
          if (bVar4) {
            pAVar2 = this->mFunction;
            puVar26 = (uint *)((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->
                                      super_EmitInfoBase).location + lVar27);
            TVar9 = WAsmJs::FromPrimitiveType<int>();
            pRVar19 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                                (&pAVar2->mTypedRegisterAllocator,TVar9);
            if (((puVar26 == (uint *)0x0) || (uVar22 = *puVar26, uVar22 == 0xffffffff)) ||
               (pRVar19->mRegisterCount <= uVar22)) {
              pAVar21 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
              AsmJsCompilationException::AsmJsCompilationException
                        (pAVar21,L"Invalid Node location[%d] ",
                         (ulong)*(uint *)((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.
                                                  ptr)->super_EmitInfoBase).location + lVar27));
              goto LAB_0093ac73;
            }
          }
        }
      }
      lVar27 = lVar27 + 8;
      uVar29 = uVar29 - 1;
    } while (uVar29 != 0);
  }
  else {
    if (argCount == 2) {
      AsmJsByteCodeWriter::AsmReg3
                ((AsmJsByteCodeWriter *)_cStack_38,local_3a,
                 local_60.super_EmitInfoBase.location.location,
                 ((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->super_EmitInfoBase).location
                 ,local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr[1].super_EmitInfoBase.location)
      ;
      goto LAB_0093a8d5;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                ,0x500,"((0))","(0)");
    if (!bVar4) {
LAB_0093ac84:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar16 = 0;
    if (uVar29 != 0) goto LAB_0093a8d5;
  }
  ByteCodeWriter::EndStatement(_cStack_38,local_68);
  AutoArrayPtr<Js::EmitExpressionInfo>::~AutoArrayPtr(&local_58);
  AutoArrayPtr<Js::AsmJsType>::~AutoArrayPtr(&local_88);
  EVar12 = local_60;
LAB_0093aa14:
  return (EmitExpressionInfo)((ulong)EVar12 & 0xffffffff | (long)local_70 << 0x20);
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitMathBuiltin(ParseNode* pnode, AsmJsMathFunction* mathFunction)
    {
        if (mathFunction->GetMathBuiltInFunction() == AsmJSMathBuiltinFunction::AsmJSMathBuiltin_max || mathFunction->GetMathBuiltInFunction() == AsmJSMathBuiltinFunction::AsmJSMathBuiltin_min)
        {
            return EmitMinMax(pnode, mathFunction);
        }

        const ArgSlot argCount = pnode->AsParseNodeCall()->argCount;
        ParseNode* argNode = pnode->AsParseNodeCall()->pnodeArgs;
        const bool isFRound = AsmJsMathFunction::IsFround(mathFunction);

        // for fround, if we have a fround(NumericLiteral), we want to just emit Ld_Flt NumericLiteral
        if (argCount == 1 && isFRound && ParserWrapper::IsFroundNumericLiteral(argNode))
        {
            StartStatement(pnode);
            RegSlot dst = mFunction->AcquireTmpRegister<float>();
            EmitExpressionInfo emitInfo(dst, AsmJsType::Float);
            float constValue = -0.0f;
            if (argNode->nop == knopFlt)
            {
                constValue = (float)argNode->AsParseNodeFloat()->dbl;
            }
            else if (argNode->nop == knopInt)
            {
                constValue = (float)argNode->AsParseNodeInt()->lw;
            }
            else
            {
                Assert(ParserWrapper::IsNegativeZero(argNode));
            }
            mWriter.AsmReg2(OpCodeAsmJs::Ld_Flt, dst, mFunction->GetConstRegister<float>(constValue));
            EndStatement(pnode);
            return emitInfo;
        }

        AutoArrayPtr<AsmJsType> types(nullptr, 0);
        AutoArrayPtr<EmitExpressionInfo> argsInfo(nullptr, 0);
        if( argCount > 0 )
        {
            types.Set(HeapNewArray(AsmJsType, argCount), argCount);
            argsInfo.Set(HeapNewArray(EmitExpressionInfo, argCount), argCount);

            for(ArgSlot i = 0; i < argCount; i++)
            {
                // Get i arg node
                ParseNode* arg = argNode;
                // Special case for fround(abs()) call
                if (argNode->nop == knopCall && isFRound)
                {
                    // Emit argument
                    const EmitExpressionInfo& argInfo = EmitCall(arg, AsmJsRetType::Float);
                    types[i] = argInfo.type;
                    argsInfo[i].type = argInfo.type;
                    argsInfo[i].location = argInfo.location;
                }
                else
                {
                    if (argNode->nop == knopList)
                    {
                        arg = ParserWrapper::GetBinaryLeft(argNode);
                        argNode = ParserWrapper::GetBinaryRight(argNode);
                    }
                    // Emit argument
                    const EmitExpressionInfo& argInfo = Emit(arg);
                    types[i] = argInfo.type;
                    argsInfo[i].type = argInfo.type;
                    argsInfo[i].location = argInfo.location;
                }
            }
        }
        StartStatement(pnode);
        // Check if this function supports the type of these arguments
        AsmJsRetType retType;
        OpCodeAsmJs op;
        const bool supported = mathFunction->SupportsMathCall( argCount, types, op, retType );
        if( !supported )
        {
            throw AsmJsCompilationException( _u("Math builtin function doesn't support arguments") );
        }

        // Release all used location before acquiring a new tmp register
        for (int i = argCount - 1; i >= 0 ; i--)
        {
            mFunction->ReleaseLocationGeneric( &argsInfo[i] );
        }

        const int argByteSize = mathFunction->GetArgByteSize(argCount) + sizeof(Var);
        // + 1 is for function object
        int runtimeArg = (int)(::ceil((double)(argByteSize / sizeof(Var)))) + 1;

        // Make sure we have enough memory allocated for OutParameters
        // + 1 for return address
        mFunction->UpdateMaxArgOutDepth(runtimeArg + 1);

        const bool isInt = retType.toType().isInt();
        const bool isFloatish = retType.toType().isFloatish();
        Assert(isInt || isFloatish || retType.toType().isDouble());

        RegSlot dst;
        if( isInt )
        {
            dst = mFunction->AcquireTmpRegister<int>();
        }
        else if (isFloatish)
        {
            dst = mFunction->AcquireTmpRegister<float>();
        }
        else
        {
            dst = mFunction->AcquireTmpRegister<double>();
        }

        EmitExpressionInfo emitInfo(dst, retType.toType());

        switch( argCount )
        {
        case 1:
            mWriter.AsmReg2( op, dst, argsInfo[0].location );
            break;
        case 2:
            mWriter.AsmReg3( op, dst, argsInfo[0].location, argsInfo[1].location );
            break;
        default:
            Assume(UNREACHED);
        }
#if DBG
        for (int i = 0; i < argCount; i++)
        {
            if (argsInfo[i].type.isSubType(AsmJsType::Floatish))
            {
                CheckNodeLocation(argsInfo[i], float);
            }
            else if (argsInfo[i].type.isSubType(AsmJsType::MaybeDouble))
            {
                CheckNodeLocation(argsInfo[i], double);
            }
            else if (argsInfo[i].type.isSubType(AsmJsType::Intish))
            {
                CheckNodeLocation(argsInfo[i], int);
            }
        }
#endif
        EndStatement(pnode);
        return emitInfo;
    }